

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O2

void cvRescale(CVodeMem cv_mem)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = cv_mem->cv_eta;
  cv_mem->cv_cvals[0] = dVar4;
  uVar1 = cv_mem->cv_q;
  uVar2 = 0;
  uVar3 = 0;
  dVar5 = dVar4;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    cv_mem->cv_cvals[uVar2 + 1] = dVar5 * dVar4;
    dVar5 = dVar5 * dVar4;
  }
  N_VScaleVectorArray(uVar1,cv_mem->cv_cvals,cv_mem->cv_zn + 1);
  dVar4 = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_h = dVar4;
  cv_mem->cv_next_h = dVar4;
  cv_mem->cv_hscale = dVar4;
  cv_mem->cv_nscon = 0;
  return;
}

Assistant:

void cvRescale(CVodeMem cv_mem)
{
  int j;

  /* compute scaling factors */
  cv_mem->cv_cvals[0] = cv_mem->cv_eta;
  for (j = 1; j <= cv_mem->cv_q; j++)
  {
    cv_mem->cv_cvals[j] = cv_mem->cv_eta * cv_mem->cv_cvals[j - 1];
  }

  (void)N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals, cv_mem->cv_zn + 1,
                            cv_mem->cv_zn + 1);

  cv_mem->cv_h      = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_next_h = cv_mem->cv_h;
  cv_mem->cv_hscale = cv_mem->cv_h;
  cv_mem->cv_nscon  = 0;
}